

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O0

int sam_hdr_link_pg(SAM_hdr *hdr)

{
  char cVar1;
  khint_t kVar2;
  int *piVar3;
  SAM_hdr_tag *pSStack_30;
  char tmp;
  SAM_hdr_tag *tag;
  khint_t k;
  int ret;
  int j;
  int i;
  SAM_hdr *hdr_local;
  
  tag._4_4_ = 0;
  hdr->npg_end_alloc = hdr->npg;
  piVar3 = (int *)realloc(hdr->pg_end,(long)hdr->npg << 2);
  hdr->pg_end = piVar3;
  if (hdr->pg_end == (int *)0x0) {
    hdr_local._4_4_ = -1;
  }
  else {
    for (ret = 0; ret < hdr->npg; ret = ret + 1) {
      hdr->pg_end[ret] = ret;
    }
    for (ret = 0; ret < hdr->npg; ret = ret + 1) {
      pSStack_30 = hdr->pg[ret].tag;
      while ((pSStack_30 != (SAM_hdr_tag *)0x0 &&
             ((*pSStack_30->str != 'P' || (pSStack_30->str[1] != 'P'))))) {
        pSStack_30 = pSStack_30->next;
      }
      if (pSStack_30 != (SAM_hdr_tag *)0x0) {
        cVar1 = pSStack_30->str[pSStack_30->len];
        pSStack_30->str[pSStack_30->len] = '\0';
        kVar2 = kh_get_m_s2i(hdr->pg_hash,pSStack_30->str + 3);
        pSStack_30->str[pSStack_30->len] = cVar1;
        if (kVar2 == hdr->pg_hash->n_buckets) {
          tag._4_4_ = -1;
        }
        else {
          hdr->pg[ret].prev_id = hdr->pg[hdr->pg_hash->vals[kVar2]].id;
          hdr->pg_end[hdr->pg_hash->vals[kVar2]] = -1;
        }
      }
    }
    k = 0;
    for (ret = 0; ret < hdr->npg; ret = ret + 1) {
      if (hdr->pg_end[ret] != -1) {
        hdr->pg_end[(int)k] = hdr->pg_end[ret];
        k = k + 1;
      }
    }
    hdr->npg_end = k;
    hdr_local._4_4_ = tag._4_4_;
  }
  return hdr_local._4_4_;
}

Assistant:

int sam_hdr_link_pg(SAM_hdr *hdr) {
    int i, j, ret = 0;

    hdr->npg_end_alloc = hdr->npg;
    hdr->pg_end = realloc(hdr->pg_end, hdr->npg * sizeof(*hdr->pg_end));
    if (!hdr->pg_end)
	return -1;

    for (i = 0; i < hdr->npg; i++)
	hdr->pg_end[i] = i;

    for (i = 0; i < hdr->npg; i++) {
	khint_t k;
	SAM_hdr_tag *tag;
	char tmp;

	for (tag = hdr->pg[i].tag; tag; tag = tag->next) {
	    if (tag->str[0] == 'P' && tag->str[1] == 'P')
		break;
	}
	if (!tag) {
	    /* Chain start points */
	    continue;
	}

	tmp = tag->str[tag->len]; tag->str[tag->len] = 0;
	k = kh_get(m_s2i, hdr->pg_hash, tag->str+3);
	tag->str[tag->len] = tmp;

	if (k == kh_end(hdr->pg_hash)) {
	    ret = -1;
	    continue;
	}

	hdr->pg[i].prev_id = hdr->pg[kh_val(hdr->pg_hash, k)].id;
	hdr->pg_end[kh_val(hdr->pg_hash, k)] = -1;
    }

    for (i = j = 0; i < hdr->npg; i++) {
	if (hdr->pg_end[i] != -1)
	    hdr->pg_end[j++] = hdr->pg_end[i];
    }
    hdr->npg_end = j;

    return ret;
}